

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_urlencode.cpp
# Opt level: O2

string * char2hex_abi_cxx11_(string *__return_storage_ptr__,char dec)

{
  byte bVar1;
  byte bVar2;
  undefined8 in_RAX;
  byte bVar3;
  undefined6 uStack_18;
  char dig2;
  char dig1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar3 = (byte)dec >> 4;
  bVar2 = dec & 0xf;
  uStack_18 = (undefined6)in_RAX;
  _uStack_18 = CONCAT17(bVar3,CONCAT16(dec,uStack_18)) & 0xff0fffffffffffff;
  bVar1 = bVar3 + 0x30;
  if (0x9fU < (byte)dec) {
    bVar1 = bVar3;
  }
  if (0x9fU >= (byte)dec || (byte)(bVar1 - 10) < 6) {
    bVar3 = bVar1 + 0x37;
    if (5 < (byte)(bVar1 - 10)) {
      bVar3 = bVar1;
    }
    _uStack_18 = CONCAT17(bVar3,_uStack_18);
  }
  bVar1 = bVar2 + 0x30;
  if (9 < bVar2) {
    bVar1 = bVar2;
  }
  if (9 >= bVar2 || (byte)(bVar1 - 10) < 6) {
    bVar2 = bVar1 + 0x37;
    if (5 < (byte)(bVar1 - 10)) {
      bVar2 = bVar1;
    }
    _uStack_18 = CONCAT16(bVar2,uStack_18);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&dig1);
  std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)&dig2);
  return __return_storage_ptr__;
}

Assistant:

std::string char2hex(char dec)
{
	std::string r;
	char dig1 = (dec&0xF0)>>4;
	char dig2 = (dec&0x0F);
	if ( 0<= dig1 && dig1<= 9) dig1+=48;    //0,48 in ascii
	if (10<= dig1 && dig1<=15) dig1+=65-10; //A,65 in ascii
	if ( 0<= dig2 && dig2<= 9) dig2+=48;
	if (10<= dig2 && dig2<=15) dig2+=65-10;

	r.append( &dig1, 1);
	r.append( &dig2, 1);
	return r;
}